

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_crop.cpp
# Opt level: O2

int main(void)

{
  int iVar1;
  long lVar2;
  int iVar3;
  uint64_t uVar4;
  Mat *pMVar5;
  int h;
  int h_00;
  int h_01;
  int h_02;
  prng_rand_t *ppVar6;
  prng_rand_t *extraout_RDX;
  uint uVar7;
  prng_rand_t *in_RDI;
  bool bVar8;
  Mat a;
  Mat local_620;
  Mat local_5e0;
  Mat local_5a0;
  Mat local_560;
  Mat local_520;
  Mat local_4e0;
  Mat local_4a0;
  Mat local_460;
  Mat local_420;
  Mat local_3e0;
  Mat local_3a0;
  Mat local_360;
  Mat local_320;
  Mat local_2e0;
  Mat local_2a0;
  Mat local_260;
  Mat local_220;
  Mat local_1e0;
  Mat local_1a0;
  Mat local_160;
  Mat local_120;
  Mat local_e0;
  Mat local_a0;
  Mat local_60;
  
  g_prng_rand_state.c = 0x37;
  g_prng_rand_state.i = 0;
  g_prng_rand_state.s[0] = 0x7685dd;
  uVar4 = 0x807685dc;
  ppVar6 = &g_prng_rand_state;
  for (lVar2 = 1; lVar2 != 0x40; lVar2 = lVar2 + 1) {
    g_prng_rand_state.s[lVar2] = uVar4;
    uVar4 = uVar4 + 0x7fffffff;
  }
  lVar2 = 10000;
  while (bVar8 = lVar2 != 0, lVar2 = lVar2 + -1, bVar8) {
    prng_rand(in_RDI);
    ppVar6 = extraout_RDX;
  }
  RandomMat(&a,0x10,(int)ppVar6,(int)uVar4);
  iVar1 = test_crop(&a,0,0,0,-0xe9,-0xe9,-0xe9,0,0,0);
  uVar7 = 1;
  if (((((iVar1 == 0) && (iVar1 = test_crop(&a,0,3,0,10,-0xe9,-0xe9,0,0,0), iVar1 == 0)) &&
       (iVar1 = test_crop(&a,5,0,0,-0xe9,6,-0xe9,0,0,0), iVar1 == 0)) &&
      (((iVar1 = test_crop(&a,5,3,0,-0xe9,-0xe9,0xc,0,0,0), iVar1 == 0 &&
        (iVar1 = test_crop(&a,0,3,4,7,-0xe9,8,0,0,0), iVar1 == 0)) &&
       ((iVar1 = test_crop(&a,5,0,5,4,-0xe9,4,0,0,0), iVar1 == 0 &&
        ((iVar1 = test_crop(&a,5,3,6,2,7,9,0,0,0), iVar1 == 0 &&
         (iVar1 = test_crop(&a,0,3,4,-0xe9,4,5,0,0,0), iVar1 == 0)))))))) &&
     (iVar1 = test_crop(&a,5,0,5,6,6,8,0,0,0), iVar1 == 0)) {
    iVar3 = 6;
    iVar1 = test_crop(&a,5,3,6,4,4,4,0,0,0);
    ncnn::Mat::~Mat(&a);
    if (iVar1 != 0) {
      return 1;
    }
    RandomMat(&a,0x10,h,iVar3);
    iVar1 = test_crop(&a,0,0,0,-0xe9,-0xe9,-0xe9,3,4,6);
    if (((((iVar1 == 0) && (iVar1 = test_crop(&a,0,3,0,10,-0xe9,-0xe9,0,3,4), iVar1 == 0)) &&
         (iVar1 = test_crop(&a,5,0,0,-0xe9,6,-0xe9,5,0,2), iVar1 == 0)) &&
        ((iVar1 = test_crop(&a,5,3,0,-0xe9,-0xe9,0xc,2,1,1), iVar1 == 0 &&
         (iVar1 = test_crop(&a,0,3,4,7,-0xe9,8,3,4,4), iVar1 == 0)))) &&
       ((iVar1 = test_crop(&a,5,0,5,4,-0xe9,4,0,3,0), iVar1 == 0 &&
        (iVar1 = test_crop(&a,5,3,6,2,7,9,1,2,3), iVar1 == 0)))) {
      iVar3 = 4;
      iVar1 = test_crop(&a,0,3,4,-0xe9,4,5,3,2,1);
      ncnn::Mat::~Mat(&a);
      if (iVar1 == 0) {
        RandomMat(&a,0x11,h_00,iVar3);
        iVar1 = test_crop(&a,0,0,0,-0xe9,-0xe9,-0xe9,3,4,6);
        if (((iVar1 == 0) && (iVar1 = test_crop(&a,0,3,0,10,-0xe9,-0xe9,0,3,4), iVar1 == 0)) &&
           ((iVar1 = test_crop(&a,5,0,0,-0xe9,6,-0xe9,5,0,2), iVar1 == 0 &&
            ((((iVar1 = test_crop(&a,5,3,0,-0xe9,-0xe9,0xc,2,1,1), iVar1 == 0 &&
               (iVar1 = test_crop(&a,0,3,4,7,-0xe9,8,3,4,4), iVar1 == 0)) &&
              (iVar1 = test_crop(&a,5,0,5,4,-0xe9,4,0,3,0), iVar1 == 0)) &&
             (iVar1 = test_crop(&a,5,3,6,2,7,9,1,2,3), iVar1 == 0)))))) {
          iVar3 = 4;
          iVar1 = test_crop(&a,0,3,4,-0xe9,4,5,3,2,1);
          ncnn::Mat::~Mat(&a);
          if (iVar1 != 0) {
            return 1;
          }
          RandomMat(&a,0x10,h_01,iVar3);
          IntArrayMat(&local_5a0,0,0,0);
          IntArrayMat(&local_5e0,100,100,100);
          uVar7 = 1;
          IntArrayMat(&local_620,0,1,2);
          iVar1 = test_crop(&a,&local_5a0,&local_5e0,&local_620);
          if (iVar1 == 0) {
            IntArrayMat(&local_60,4);
            IntArrayMat(&local_a0,8);
            IntArrayMat(&local_e0,0);
            pMVar5 = &local_e0;
            iVar1 = test_crop(&a,&local_60,&local_a0,pMVar5);
            iVar3 = (int)pMVar5;
            if (iVar1 == 0) {
              IntArrayMat(&local_120,2);
              IntArrayMat(&local_160,7);
              IntArrayMat(&local_1a0,1);
              pMVar5 = &local_1a0;
              iVar1 = test_crop(&a,&local_120,&local_160,pMVar5);
              iVar3 = (int)pMVar5;
              if (iVar1 == 0) {
                IntArrayMat(&local_1e0,3);
                IntArrayMat(&local_220,5);
                IntArrayMat(&local_260,2);
                pMVar5 = &local_260;
                iVar1 = test_crop(&a,&local_1e0,&local_220,pMVar5);
                iVar3 = (int)pMVar5;
                if (iVar1 == 0) {
                  IntArrayMat(&local_2a0,2,1);
                  IntArrayMat(&local_2e0,4,-2);
                  IntArrayMat(&local_320,0,1);
                  pMVar5 = &local_320;
                  iVar1 = test_crop(&a,&local_2a0,&local_2e0,pMVar5);
                  iVar3 = (int)pMVar5;
                  if (iVar1 == 0) {
                    IntArrayMat(&local_360,1,4);
                    IntArrayMat(&local_3a0,-5,7);
                    IntArrayMat(&local_3e0,1,-3);
                    pMVar5 = &local_3e0;
                    iVar1 = test_crop(&a,&local_360,&local_3a0,pMVar5);
                    iVar3 = (int)pMVar5;
                    if (iVar1 == 0) {
                      IntArrayMat(&local_420,2,1);
                      IntArrayMat(&local_460,4,-2);
                      IntArrayMat(&local_4a0,-1,-2);
                      pMVar5 = &local_4a0;
                      iVar1 = test_crop(&a,&local_420,&local_460,pMVar5);
                      iVar3 = (int)pMVar5;
                      if (iVar1 == 0) {
                        IntArrayMat(&local_4e0,1,2,3);
                        IntArrayMat(&local_520,-3,-2,-1);
                        IntArrayMat(&local_560,-3,-2,-1);
                        pMVar5 = &local_560;
                        iVar1 = test_crop(&a,&local_4e0,&local_520,pMVar5);
                        iVar3 = (int)pMVar5;
                        bVar8 = iVar1 == 0;
                        ncnn::Mat::~Mat(&local_560);
                        ncnn::Mat::~Mat(&local_520);
                        ncnn::Mat::~Mat(&local_4e0);
                      }
                      else {
                        bVar8 = false;
                      }
                      ncnn::Mat::~Mat(&local_4a0);
                      ncnn::Mat::~Mat(&local_460);
                      ncnn::Mat::~Mat(&local_420);
                    }
                    else {
                      bVar8 = false;
                    }
                    ncnn::Mat::~Mat(&local_3e0);
                    ncnn::Mat::~Mat(&local_3a0);
                    ncnn::Mat::~Mat(&local_360);
                  }
                  else {
                    bVar8 = false;
                  }
                  ncnn::Mat::~Mat(&local_320);
                  ncnn::Mat::~Mat(&local_2e0);
                  ncnn::Mat::~Mat(&local_2a0);
                }
                else {
                  bVar8 = false;
                }
                ncnn::Mat::~Mat(&local_260);
                ncnn::Mat::~Mat(&local_220);
                ncnn::Mat::~Mat(&local_1e0);
              }
              else {
                bVar8 = false;
              }
              ncnn::Mat::~Mat(&local_1a0);
              ncnn::Mat::~Mat(&local_160);
              ncnn::Mat::~Mat(&local_120);
            }
            else {
              bVar8 = false;
            }
            ncnn::Mat::~Mat(&local_e0);
            ncnn::Mat::~Mat(&local_a0);
            ncnn::Mat::~Mat(&local_60);
            ncnn::Mat::~Mat(&local_620);
            ncnn::Mat::~Mat(&local_5e0);
            ncnn::Mat::~Mat(&local_5a0);
            ncnn::Mat::~Mat(&a);
            if (!bVar8) {
              return 1;
            }
            RandomMat(&a,0x11,h_02,iVar3);
            IntArrayMat(&local_5a0,0,0,0);
            IntArrayMat(&local_5e0,100,100,100);
            uVar7 = 1;
            IntArrayMat(&local_620,0,1,2);
            iVar1 = test_crop(&a,&local_5a0,&local_5e0,&local_620);
            if (iVar1 == 0) {
              IntArrayMat(&local_60,4);
              IntArrayMat(&local_a0,8);
              IntArrayMat(&local_e0,0);
              iVar1 = test_crop(&a,&local_60,&local_a0,&local_e0);
              if (iVar1 == 0) {
                IntArrayMat(&local_120,2);
                IntArrayMat(&local_160,7);
                uVar7 = 1;
                IntArrayMat(&local_1a0,1);
                iVar1 = test_crop(&a,&local_120,&local_160,&local_1a0);
                if (iVar1 == 0) {
                  IntArrayMat(&local_1e0,3);
                  IntArrayMat(&local_220,5);
                  IntArrayMat(&local_260,2);
                  iVar1 = test_crop(&a,&local_1e0,&local_220,&local_260);
                  if (iVar1 == 0) {
                    IntArrayMat(&local_2a0,2,1);
                    IntArrayMat(&local_2e0,4,-2);
                    uVar7 = 1;
                    IntArrayMat(&local_320,0,1);
                    iVar1 = test_crop(&a,&local_2a0,&local_2e0,&local_320);
                    if (iVar1 == 0) {
                      IntArrayMat(&local_360,1,4);
                      IntArrayMat(&local_3a0,-5,7);
                      uVar7 = 1;
                      IntArrayMat(&local_3e0,1,-3);
                      iVar1 = test_crop(&a,&local_360,&local_3a0,&local_3e0);
                      if (iVar1 == 0) {
                        uVar7 = 1;
                        IntArrayMat(&local_420,2,1);
                        IntArrayMat(&local_460,4,-2);
                        IntArrayMat(&local_4a0,-1,-2);
                        iVar1 = test_crop(&a,&local_420,&local_460,&local_4a0);
                        if (iVar1 == 0) {
                          IntArrayMat(&local_4e0,1,2,3);
                          IntArrayMat(&local_520,-3,-2,-1);
                          IntArrayMat(&local_560,-3,-2,-1);
                          iVar1 = test_crop(&a,&local_4e0,&local_520,&local_560);
                          uVar7 = (uint)(iVar1 != 0);
                          ncnn::Mat::~Mat(&local_560);
                          ncnn::Mat::~Mat(&local_520);
                          ncnn::Mat::~Mat(&local_4e0);
                        }
                        ncnn::Mat::~Mat(&local_4a0);
                        ncnn::Mat::~Mat(&local_460);
                        ncnn::Mat::~Mat(&local_420);
                      }
                      ncnn::Mat::~Mat(&local_3e0);
                      ncnn::Mat::~Mat(&local_3a0);
                      ncnn::Mat::~Mat(&local_360);
                    }
                    ncnn::Mat::~Mat(&local_320);
                    ncnn::Mat::~Mat(&local_2e0);
                    ncnn::Mat::~Mat(&local_2a0);
                  }
                  else {
                    uVar7 = 1;
                  }
                  ncnn::Mat::~Mat(&local_260);
                  ncnn::Mat::~Mat(&local_220);
                  ncnn::Mat::~Mat(&local_1e0);
                }
                ncnn::Mat::~Mat(&local_1a0);
                ncnn::Mat::~Mat(&local_160);
                ncnn::Mat::~Mat(&local_120);
              }
              else {
                uVar7 = 1;
              }
              ncnn::Mat::~Mat(&local_e0);
              ncnn::Mat::~Mat(&local_a0);
              ncnn::Mat::~Mat(&local_60);
            }
          }
          ncnn::Mat::~Mat(&local_620);
          ncnn::Mat::~Mat(&local_5e0);
          ncnn::Mat::~Mat(&local_5a0);
          goto LAB_001126dc;
        }
        ncnn::Mat::~Mat(&a);
      }
      return 1;
    }
  }
LAB_001126dc:
  ncnn::Mat::~Mat(&a);
  return uVar7;
}

Assistant:

int main()
{
    SRAND(7767517);

    return 0
        || test_crop_0()
        || test_crop_1()
        || test_crop_2()
        || test_crop_3()
        || test_crop_4()
        ;
}